

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_floor_l_s_mipsel(CPUMIPSState_conflict4 *env,uint32_t fst0)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  uint64_t local_20;
  uint64_t dt2;
  uint32_t fst0_local;
  CPUMIPSState_conflict4 *env_local;
  
  set_float_rounding_mode(1,&(env->active_fpu).fp_status);
  local_20 = float32_to_int64_mipsel(fst0,&(env->active_fpu).fp_status);
  restore_rounding_mode(env);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if ((uVar1 & 9) != 0) {
    local_20 = 0x7fffffffffffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return local_20;
}

Assistant:

uint64_t helper_float_floor_l_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_down, &env->active_fpu.fp_status);
    dt2 = float32_to_int64(fst0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        dt2 = FP_TO_INT64_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return dt2;
}